

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_lock.cpp
# Opt level: O2

unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> __thiscall
duckdb::StorageLockInternals::TryUpgradeCheckpointLock
          (StorageLockInternals *this,StorageLockKey *lock)

{
  bool bVar1;
  InternalException *this_00;
  long in_RDX;
  StorageLockType local_44;
  string local_40;
  
  if (*(int *)(in_RDX + 0x10) != 0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"StorageLock::TryUpgradeLock called on an exclusive lock",
               (allocator *)&local_44);
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = ::std::mutex::try_lock((mutex *)&lock->type);
  if (bVar1) {
    if (lock[2].internals.internal.
        super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
      enable_shared_from_this<duckdb::StorageLockInternals>::shared_from_this
                ((enable_shared_from_this<duckdb::StorageLockInternals> *)&local_40);
      local_44 = EXCLUSIVE;
      make_uniq<duckdb::StorageLockKey,duckdb::shared_ptr<duckdb::StorageLockInternals,true>,duckdb::StorageLockType>
                ((duckdb *)this,(shared_ptr<duckdb::StorageLockInternals,_true> *)&local_40,
                 &local_44);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
      return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
             (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)this;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&lock->type);
  }
  (this->super_enable_shared_from_this<duckdb::StorageLockInternals>).__weak_this_.internal.
  super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)this;
}

Assistant:

unique_ptr<StorageLockKey> TryUpgradeCheckpointLock(StorageLockKey &lock) {
		if (lock.GetType() != StorageLockType::SHARED) {
			throw InternalException("StorageLock::TryUpgradeLock called on an exclusive lock");
		}
		if (!exclusive_lock.try_lock()) {
			// could not lock mutex
			return nullptr;
		}
		if (read_count != 1) {
			// other shared locks are active: failed to upgrade
			D_ASSERT(read_count != 0);
			exclusive_lock.unlock();
			return nullptr;
		}
		// no other shared locks active: success!
		return make_uniq<StorageLockKey>(shared_from_this(), StorageLockType::EXCLUSIVE);
	}